

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private.hpp
# Opt level: O2

void __thiscall
baryonyx::to_log<unsigned_int>(baryonyx *this,FILE *os,uint indent,string_view fmt,uint *args)

{
  undefined4 in_register_00000014;
  uint local_2c;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  local_28._M_len = CONCAT44(in_register_00000014,indent);
  local_28._M_str = (char *)fmt._M_len;
  local_2c = (uint)os;
  ::fmt::v7::print<char[6],char_const(&)[1],unsigned_int&,char>
            ((FILE *)this,(char (*) [6])"{:{}}",(char (*) [1])0x549c3d,&local_2c);
  ::fmt::v7::print<std::basic_string_view<char,std::char_traits<char>>,unsigned_int_const&,char>
            ((FILE *)this,&local_28,(uint *)fmt._M_str);
  return;
}

Assistant:

void
to_log([[maybe_unused]] std::FILE* os,
       [[maybe_unused]] unsigned indent,
       [[maybe_unused]] const std::string_view fmt,
       [[maybe_unused]] const Args&... args)
{
#ifdef BARYONYX_ENABLE_LOG
#ifdef BARYONYX_ENABLE_DEBUG
    fmt::print(os, "{:{}}", "", indent);
    fmt::print(os, fmt, args...);
#endif
#endif
}